

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::AsyncInputStream::pumpTo(AsyncInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  uint64_t in_RCX;
  char local_38 [8];
  _func_int **local_30;
  
  (**(code **)(*(long *)amount + 0x10))(local_38,amount,output);
  if (local_38[0] == '\x01') {
    this->_vptr_AsyncInputStream = local_30;
  }
  else {
    unoptimizedPumpTo((kj *)this,(AsyncInputStream *)output,(AsyncOutputStream *)amount,in_RCX,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> AsyncInputStream::pumpTo(
    AsyncOutputStream& output, uint64_t amount) {
  // See if output wants to dispatch on us.
  KJ_IF_SOME(result, output.tryPumpFrom(*this, amount)) {
    return kj::mv(result);
  }

  // OK, fall back to naive approach.
  return unoptimizedPumpTo(*this, output, amount);
}